

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geofile_operations.cpp
# Opt level: O3

int __thiscall GEO::geofile::merge_physical_entities(geofile *this,geofile *secondary_file)

{
  if ((secondary_file->physical_points_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    merge_physical_points(this,secondary_file);
  }
  if ((secondary_file->physical_curves_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    merge_physical_curves(this,secondary_file);
  }
  if ((secondary_file->physical_surfaces_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
  {
    merge_physical_surfaces(this,secondary_file);
  }
  if ((secondary_file->physical_volumes_map)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)
  {
    merge_physical_volumes(this,secondary_file);
  }
  return 0;
}

Assistant:

int GEO::geofile::merge_physical_entities(geofile &secondary_file)
{
    if(!secondary_file.physical_points_map.empty())
        merge_physical_points(secondary_file);
    if(!secondary_file.physical_curves_map.empty())
        merge_physical_curves(secondary_file);
    if(!secondary_file.physical_surfaces_map.empty())
        merge_physical_surfaces(secondary_file);
    if(!secondary_file.physical_volumes_map.empty())
        merge_physical_volumes(secondary_file);
    return EXIT_SUCCESS;
}